

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O0

size_t get_FMfieldLong_by_name(FMFieldList field_list,char *fieldname,void *data)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  FMgetFieldStruct descr;
  int index;
  void *in_stack_ffffffffffffffb8;
  int local_24;
  size_t local_8;
  
  local_24 = 0;
  while ((*(long *)(in_RDI + (long)local_24 * 0x18) != 0 &&
         (iVar1 = strcmp(*(char **)(in_RDI + (long)local_24 * 0x18),in_RSI), iVar1 != 0))) {
    local_24 = local_24 + 1;
  }
  if (*(long *)(in_RDI + (long)local_24 * 0x18) == 0) {
    printf("Field %s not found\n",in_RSI);
    local_8 = 0;
  }
  else {
    local_8 = get_FMlong((FMFieldPtr)(long)*(int *)(in_RDI + (long)local_24 * 0x18 + 0x14),
                         in_stack_ffffffffffffffb8);
  }
  return local_8;
}

Assistant:

extern size_t
get_FMfieldLong_by_name(FMFieldList field_list, const char *fieldname, void *data)
{
    int index;
    FMgetFieldStruct descr;

    for (index = 0; field_list[index].field_name != NULL; index++) {
	if (strcmp(field_list[index].field_name, fieldname) == 0) {
	    break;
	}
    }
    if (field_list[index].field_name == NULL) {
	printf("Field %s not found\n", fieldname);
	return 0;
    }

    descr.offset = field_list[index].field_offset;
    descr.size = field_list[index].field_size;
    descr.data_type = integer_type;
    descr.byte_swap = 0;
    descr.src_float_format = descr.target_float_format = Format_IEEE_754_bigendian;
    return get_FMlong(&descr, data);
}